

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_key.c
# Opt level: O2

int check_fixed_str(char *card,FILE *out)

{
  long lVar1;
  char *__format;
  
  if (card[10] == '\'') {
    for (lVar1 = 0xb; card[lVar1] != '\''; lVar1 = lVar1 + 1) {
      if (card[lVar1] == '\0') {
        sprintf(errmes,"%.8s mandatory string keyword missing closing quote character:",card);
        wrterr(out,errmes,1);
        goto LAB_0010e0cf;
      }
    }
    if (0x12 < lVar1) {
      return 1;
    }
    __format = "%.8s mandatory string keyword ends before column 20.";
  }
  else {
    __format = "%.8s mandatory string keyword does not start in col 11.";
  }
  sprintf(errmes,__format,card);
  wrterr(out,errmes,1);
  print_fmt(out,card,0xd);
  card = "          ^--------^";
LAB_0010e0cf:
  print_fmt(out,card,0xd);
  return 0;
}

Assistant:

int check_fixed_str(char* card, FILE *out) 
{
    char *cptr;

    /* fixed format string must have quotes in columns 11 and >= 20 */
    /* This only applys to the XTENSION and TFORMn keywords. */

    cptr = &card[10];

    if (*cptr != '\'' ) {
        sprintf(errmes,
            "%.8s mandatory string keyword does not start in col 11.",
        card);
        wrterr(out,errmes,1); 
        print_fmt(out,card,13);
          print_fmt(out,"          ^--------^",13);
        return 0;
    }

    cptr++;

    while (*cptr != '\'') {

        if (*cptr == '\0') {
          sprintf(errmes,
            "%.8s mandatory string keyword missing closing quote character:",
          card);
          wrterr(out,errmes,1); 
          print_fmt(out,card,13);
          return 0;
        }
        cptr++; 
    } 

    if ((cptr - card)  < 19) {
        sprintf(errmes,
            "%.8s mandatory string keyword ends before column 20.",
        card);
        wrterr(out,errmes,1); 
        print_fmt(out,card,13);
        print_fmt(out,"          ^--------^",13);

        return 0;
    } 

    return 1; 
}